

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O2

bool cppjieba::DecodeUTF8RunesInString(char *s,size_t len,Unicode *unicode)

{
  bool bVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  RuneStrArray runes;
  RuneStrArray local_180;
  
  limonp::LocalVector<unsigned_int>::clear(unicode);
  memset(&local_180,0,0x140);
  local_180.size_ = 0;
  local_180.capacity_ = 0x10;
  local_180.ptr_ = local_180.buffer_;
  bVar1 = DecodeUTF8RunesInString(s,len,&local_180);
  if (bVar1) {
    limonp::LocalVector<unsigned_int>::reserve(unicode,local_180.size_);
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < local_180.size_; uVar3 = uVar3 + 1) {
      limonp::LocalVector<unsigned_int>::push_back
                (unicode,(uint *)((long)&((RuneStr *)&(local_180.ptr_)->rune)->rune + lVar2));
      lVar2 = lVar2 + 0x14;
    }
  }
  limonp::LocalVector<cppjieba::RuneStr>::~LocalVector(&local_180);
  return bVar1;
}

Assistant:

inline bool DecodeUTF8RunesInString(const char* s, size_t len, Unicode& unicode) {
  unicode.clear();
  RuneStrArray runes;
  if (!DecodeUTF8RunesInString(s, len, runes)) {
    return false;
  }
  unicode.reserve(runes.size());
  for (size_t i = 0; i < runes.size(); i++) {
    unicode.push_back(runes[i].rune);
  }
  return true;
}